

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gpio.cpp
# Opt level: O2

void __thiscall
GPIO::GPIOBase::SoftThread::SoftThread
          (SoftThread *this,GPIO_MODE what,uint gpio,uint range,uint value)

{
  _Head_base<0UL,_std::thread_*,_false> __p;
  GPIOError *this_00;
  _Head_base<0UL,_std::thread_*,_false> local_40;
  SoftThread *local_38;
  SoftThread *local_30;
  undefined8 local_28;
  
  (this->m_thread)._M_t.super___uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_>._M_t.
  super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread>_>.
  super__Head_base<0UL,_std::thread_*,_false>._M_head_impl = (thread *)0x0;
  this->m_range = range;
  this->m_value = value;
  this->m_mark = (__atomic_base<unsigned_int>)0x0;
  this->m_space = (__atomic_base<unsigned_int>)0x0;
  this->m_gpio = gpio;
  if (range == 0) {
    this_00 = (GPIOError *)__cxa_allocate_exception(0x10);
    GPIOError::runtime_error(this_00,"range == 0");
  }
  else {
    if (value <= range) {
      set_value(this,value);
      local_38 = this;
      if (what == SOFT_TONE_OUTPUT) {
        local_30 = (SoftThread *)run_tone;
        local_28 = 0;
        std::
        make_unique<std::thread,void(GPIO::GPIOBase::SoftThread::*)(),GPIO::GPIOBase::SoftThread*>
                  ((type *)&local_40,&local_30);
      }
      else {
        if (what != SOFT_PWM_OUTPUT) {
          this_00 = (GPIOError *)__cxa_allocate_exception(0x10);
          GPIOError::runtime_error(this_00,"invalid mode");
          goto LAB_0011038c;
        }
        local_30 = (SoftThread *)run_pwm;
        local_28 = 0;
        std::
        make_unique<std::thread,void(GPIO::GPIOBase::SoftThread::*)(),GPIO::GPIOBase::SoftThread*>
                  ((type *)&local_40,&local_30);
      }
      __p._M_head_impl = local_40._M_head_impl;
      local_40._M_head_impl = (thread *)0x0;
      std::__uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_>::reset
                ((__uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_> *)this,
                 __p._M_head_impl);
      std::unique_ptr<std::thread,_std::default_delete<std::thread>_>::~unique_ptr
                ((unique_ptr<std::thread,_std::default_delete<std::thread>_> *)&local_40);
      return;
    }
    this_00 = (GPIOError *)__cxa_allocate_exception(0x10);
    GPIOError::runtime_error(this_00,"value > range");
  }
LAB_0011038c:
  __cxa_throw(this_00,&GPIOError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

GPIOBase::SoftThread::SoftThread(GPIO_MODE what, unsigned int gpio, unsigned int range, unsigned int value)
: m_range(range)
, m_value(value)
, m_gpio(gpio)
{
    if (m_range == 0) throw GPIOError("range == 0");
    if (m_value > m_range) throw GPIOError("value > range");

    // compute the mark and space values

    set_value(m_value);

    switch (what) {
        case GPIO_MODE::SOFT_PWM_OUTPUT:
            m_thread = std::make_unique<std::thread>(&GPIOBase::SoftThread::run_pwm, this);
            break;
        case GPIO_MODE::SOFT_TONE_OUTPUT:
            m_thread = std::make_unique<std::thread>(&GPIOBase::SoftThread::run_tone, this);
            break;
        default: throw GPIOError("invalid mode");
    }
}